

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cpp
# Opt level: O0

void __thiscall xercesc_4_0::InputSource::setSystemId(InputSource *this,XMLCh *systemId)

{
  XMLCh *pXVar1;
  XMLCh *systemId_local;
  InputSource *this_local;
  
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
  pXVar1 = XMLString::replicate(systemId,this->fMemoryManager);
  this->fSystemId = pXVar1;
  return;
}

Assistant:

void InputSource::setSystemId(const XMLCh* const systemId)
{
    fMemoryManager->deallocate(fSystemId);
    fSystemId = XMLString::replicate(systemId, fMemoryManager);
}